

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

TriangleMesh *
pbrt::Triangle::CreateMesh
          (Transform *renderFromObject,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  pointer v;
  ulong uVar6;
  char *message;
  bool reverseOrientation_local;
  string ret;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  vector<int,_std::allocator<int>_> local_b8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> S;
  vector<int,_std::allocator<int>_> faceIndices;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> N;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uvs;
  Allocator alloc_local;
  int local_38;
  int local_34;
  TriangleMesh *p;
  
  paVar1 = &ret.field_2;
  reverseOrientation_local = reverseOrientation;
  ret._M_dataplus._M_p = (pointer)paVar1;
  alloc_local = alloc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"indices","");
  ParameterDictionary::GetIntArray(&local_b8,parameters,&ret);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != paVar1) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  ret._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"P","");
  ParameterDictionary::GetPoint3fArray(&P,parameters,&ret);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != paVar1) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  ret._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"uv","");
  ParameterDictionary::GetPoint2fArray(&uvs,parameters,&ret);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != paVar1) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x24) {
      ret._M_dataplus._M_p = (pointer)0x100000000;
      ret._M_string_length = CONCAT44(ret._M_string_length._4_4_,2);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&local_b8,&ret);
      goto LAB_0020ba47;
    }
    message = "Vertex indices \"indices\" must be provided with triangle mesh.";
  }
  else {
    uVar5 = (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar6 = uVar5 % 3;
    if (uVar6 != 0) {
      S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = (undefined4)uVar5;
      N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = (undefined4)uVar6;
      ret._M_string_length = 0;
      ret.field_2._M_local_buf[0] = '\0';
      ret._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<int,int>
                (&ret,"Number of vertex indices %d not a multiple of 3. Discarding %d excess.",
                 (int *)&S,(int *)&N);
      Error(loc,ret._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      for (lVar4 = (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          0x5555555555555555 < (ulong)((lVar4 >> 2) * -0x5555555555555555); lVar4 = lVar4 + -4) {
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
    }
LAB_0020ba47:
    if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 !=
          ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
        Error(loc,"Number of \"uv\"s for triangle mesh must match \"P\"s. Discarding uvs.");
        std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
        _M_assign_aux<pbrt::Point2<float>const*>
                  ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&uvs,0,0);
      }
      ret._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"S","");
      ParameterDictionary::GetVector3fArray(&S,parameters,&ret);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if (((pointer)CONCAT44(S.
                             super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             S.
                             super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
           S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)CONCAT44(S.
                         super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         S.
                         super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        Error(loc,"Number of \"S\"s for triangle mesh must match \"P\"s. Discarding \"S\"s.");
        std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>::
        _M_assign_aux<pbrt::Vector3<float>const*>
                  ((vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>> *)&S,0,0);
      }
      ret._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"N","");
      ParameterDictionary::GetNormal3fArray(&N,parameters,&ret);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if (((pointer)CONCAT44(N.
                             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             N.
                             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
           N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)CONCAT44(N.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         N.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        Error(loc,"Number of \"N\"s for triangle mesh must match \"P\"s. Discarding \"N\"s.");
        std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>::
        _M_assign_aux<pbrt::Normal3<float>const*>
                  ((vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>> *)&N,0,0);
      }
      if ((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar4 = (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar5 = ((long)P.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)P.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        lVar4 = lVar4 + (ulong)(lVar4 == 0);
        v = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
        do {
          if (uVar5 < (ulong)(long)*v || uVar5 - (long)*v == 0) {
            faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = (undefined4)uVar5;
            ret._M_string_length = 0;
            ret.field_2._M_local_buf[0] = '\0';
            ret._M_dataplus._M_p = (pointer)paVar1;
            detail::stringPrintfRecursive<int&,int>
                      (&ret,
                       "trianglemesh has out of-bounds vertex index %d (%d \"P\" values were given. Discarding this mesh."
                       ,v,(int *)&faceIndices);
            Error(loc,ret._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ret._M_dataplus._M_p != paVar1) {
              operator_delete(ret._M_dataplus._M_p,
                              CONCAT71(ret.field_2._M_allocated_capacity._1_7_,
                                       ret.field_2._M_local_buf[0]) + 1);
            }
            p = (TriangleMesh *)0x0;
            goto LAB_0020bddc;
          }
          v = v + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      ret._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"faceIndices","");
      ParameterDictionary::GetIntArray(&faceIndices,parameters,&ret);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((pointer)CONCAT44(faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) !=
          faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar5 = (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)CONCAT44(faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) >> 2;
        uVar6 = (ulong)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) / 3;
        if (uVar5 != uVar6) {
          local_34 = (int)uVar5;
          local_38 = (int)uVar6;
          ret._M_string_length = 0;
          ret.field_2._M_local_buf[0] = '\0';
          ret._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<int,int>
                    (&ret,
                     "Number of face indices %d does not match number of triangles %d. Discarding face indices."
                     ,&local_34,&local_38);
          Error(loc,ret._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ret._M_dataplus._M_p != paVar1) {
            operator_delete(ret._M_dataplus._M_p,
                            CONCAT71(ret.field_2._M_allocated_capacity._1_7_,
                                     ret.field_2._M_local_buf[0]) + 1);
          }
          std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                    ((vector<int,std::allocator<int>> *)&faceIndices,0,0);
        }
      }
      iVar3 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                        (alloc_local.memoryResource,0x40,8);
      p = (TriangleMesh *)CONCAT44(extraout_var,iVar3);
      pstd::pmr::polymorphic_allocator<std::byte>::
      construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                (&alloc_local,p,renderFromObject,&reverseOrientation_local,&local_b8,&P,&S,&N,&uvs,
                 &faceIndices);
      pvVar2 = (void *)CONCAT44(faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)faceIndices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
LAB_0020bddc:
      pvVar2 = (void *)CONCAT44(N.
                                super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                N.
                                super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)N.
                                     super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      pvVar2 = (void *)CONCAT44(S.
                                super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                S.
                                super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)S.
                                     super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      goto LAB_0020be10;
    }
    message = "Vertex positions \"P\" must be provided with triangle mesh.";
  }
  Error(loc,message);
  p = (TriangleMesh *)0x0;
LAB_0020be10:
  if (uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uvs.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)uvs.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)uvs.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)P.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)P.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return p;
}

Assistant:

TriangleMesh *Triangle::CreateMesh(const Transform *renderFromObject,
                                   bool reverseOrientation,
                                   const ParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    std::vector<int> vi = parameters.GetIntArray("indices");
    std::vector<Point3f> P = parameters.GetPoint3fArray("P");
    std::vector<Point2f> uvs = parameters.GetPoint2fArray("uv");

    if (vi.empty()) {
        if (P.size() == 3)
            vi = {0, 1, 2};
        else {
            Error(loc, "Vertex indices \"indices\" must be provided with "
                       "triangle mesh.");
            return {};
        }
    } else if ((vi.size() % 3) != 0u) {
        Error(loc,
              "Number of vertex indices %d not a multiple of 3. Discarding %d "
              "excess.",
              int(vi.size()), int(vi.size() % 3));
        while ((vi.size() % 3) != 0u)
            vi.pop_back();
    }

    if (P.empty()) {
        Error(loc, "Vertex positions \"P\" must be provided with triangle mesh.");
        return {};
    }

    if (!uvs.empty() && uvs.size() != P.size()) {
        Error(loc, "Number of \"uv\"s for triangle mesh must match \"P\"s. "
                   "Discarding uvs.");
        uvs = {};
    }

    std::vector<Vector3f> S = parameters.GetVector3fArray("S");
    if (!S.empty() && S.size() != P.size()) {
        Error(loc, "Number of \"S\"s for triangle mesh must match \"P\"s. "
                   "Discarding \"S\"s.");
        S = {};
    }
    std::vector<Normal3f> N = parameters.GetNormal3fArray("N");
    if (!N.empty() && N.size() != P.size()) {
        Error(loc, "Number of \"N\"s for triangle mesh must match \"P\"s. "
                   "Discarding \"N\"s.");
        N = {};
    }

    for (size_t i = 0; i < vi.size(); ++i)
        if (vi[i] >= P.size()) {
            Error(loc,
                  "trianglemesh has out of-bounds vertex index %d (%d \"P\" "
                  "values were given. Discarding this mesh.",
                  vi[i], (int)P.size());
            return {};
        }

    std::vector<int> faceIndices = parameters.GetIntArray("faceIndices");
    if (!faceIndices.empty() && faceIndices.size() != vi.size() / 3) {
        Error(loc,
              "Number of face indices %d does not match number of triangles %d. "
              "Discarding face indices.",
              int(faceIndices.size()), int(vi.size() / 3));
        faceIndices = {};
    }

    return alloc.new_object<TriangleMesh>(
        *renderFromObject, reverseOrientation, std::move(vi), std::move(P), std::move(S),
        std::move(N), std::move(uvs), std::move(faceIndices));
}